

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::input_stream_adapter::~input_stream_adapter(input_stream_adapter *this)

{
  istream *piVar1;
  
  piVar1 = this->is;
  if (piVar1 != (istream *)0x0) {
    std::ios::clear((int)piVar1 + (int)*(undefined8 *)(*(long *)piVar1 + -0x18));
  }
  return;
}

Assistant:

~input_stream_adapter()
    {
        // clear stream flags; we use underlying streambuf I/O, do not
        // maintain ifstream flags, except eof
        if (is != nullptr)
        {
            is->clear(is->rdstate() & std::ios::eofbit);
        }
    }